

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::BaseModeFunction<duckdb::ModeString>::
     Execute<duckdb::string_t,duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::EntropyFallbackFunction<duckdb::ModeString>>
               (ModeState<duckdb::string_t,_duckdb::ModeString> *state,string_t *key,
               AggregateInputData *input_data)

{
  MAP_TYPE *pMVar1;
  mapped_type *pmVar2;
  unsigned_long uVar3;
  key_type *in_RDX;
  OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
  *in_RSI;
  long in_RDI;
  mapped_type *i;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    pMVar1 = ModeString::CreateEmpty((ArenaAllocator *)in_RSI);
    *(MAP_TYPE **)(in_RDI + 0x18) = pMVar1;
  }
  pmVar2 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
           ::operator[](in_RSI,in_RDX);
  pmVar2->count = pmVar2->count + 1;
  uVar3 = MinValue<unsigned_long>(pmVar2->first_row,*(unsigned_long *)(in_RDI + 0x38));
  pmVar2->first_row = uVar3;
  *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 1;
  return;
}

Assistant:

static void Execute(STATE &state, const INPUT_TYPE &key, AggregateInputData &input_data) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(input_data.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		++i.count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		++state.count;
	}